

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O3

int __thiscall fmt::SystemError::init(SystemError *this,EVP_PKEY_CTX *ctx)

{
  undefined1 *extraout_RAX;
  undefined1 *puVar1;
  void *in_RCX;
  int in_EDX;
  size_t in_R8;
  StringRef message;
  MemoryWriter w;
  long *local_4a0;
  char *local_498;
  long local_490 [2];
  BasicWriter<char> local_480;
  Buffer<char> local_470;
  char local_450 [504];
  undefined **local_258;
  undefined ***local_250;
  undefined **local_248;
  undefined1 *local_240;
  undefined8 local_238;
  ulong local_230;
  undefined1 local_228 [504];
  
  this->error_code_ = (int)ctx;
  local_250 = &local_248;
  local_258 = &PTR__BasicMemoryWriter_0014c588;
  local_240 = local_228;
  local_238 = 0;
  local_230 = 500;
  local_248 = &PTR_grow_0014c5d0;
  local_480.buffer_ = &local_470;
  local_480._vptr_BasicWriter = (_func_int **)&PTR__BasicMemoryWriter_0014c588;
  local_470.size_ = 0;
  local_470.capacity_ = 500;
  local_470._vptr_Buffer = (_func_int **)&PTR_grow_0014c5d0;
  local_470.ptr_ = local_450;
  BasicWriter<char>::write(&local_480,in_EDX,in_RCX,in_R8);
  local_4a0 = local_490;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_4a0,(local_480.buffer_)->ptr_,
             (local_480.buffer_)->ptr_ + (local_480.buffer_)->size_);
  local_480._vptr_BasicWriter = (_func_int **)&PTR__BasicMemoryWriter_0014c588;
  local_470._vptr_Buffer = (_func_int **)&PTR_grow_0014c5d0;
  if (local_470.ptr_ != local_450) {
    operator_delete(local_470.ptr_,local_470.capacity_);
  }
  message.size_ = in_R8;
  message.data_ = local_498;
  internal::format_system_error
            ((internal *)&local_258,(Writer *)((ulong)ctx & 0xffffffff),(int)local_4a0,message);
  if (local_4a0 != local_490) {
    operator_delete(local_4a0,local_490[0] + 1);
  }
  local_480._vptr_BasicWriter = (_func_int **)&local_470;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_480,local_250[1],(long)local_250[2] + (long)local_250[1]);
  std::runtime_error::runtime_error((runtime_error *)&local_4a0,(string *)&local_480);
  std::runtime_error::operator=((runtime_error *)this,(runtime_error *)&local_4a0);
  std::runtime_error::~runtime_error((runtime_error *)&local_4a0);
  if ((Buffer<char> *)local_480._vptr_BasicWriter != &local_470) {
    operator_delete(local_480._vptr_BasicWriter,(long)local_470._vptr_Buffer + 1);
  }
  local_258 = &PTR__BasicMemoryWriter_0014c588;
  local_248 = &PTR_grow_0014c5d0;
  puVar1 = local_228;
  if (local_240 != puVar1) {
    operator_delete(local_240,local_230);
    puVar1 = extraout_RAX;
  }
  return (int)puVar1;
}

Assistant:

FMT_FUNC void fmt::SystemError::init(
    int err_code, CStringRef format_str, ArgList args) {
  error_code_ = err_code;
  MemoryWriter w;
  internal::format_system_error(w, err_code, format(format_str, args));
  std::runtime_error &base = *this;
  base = std::runtime_error(w.str());
}